

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_tcp_ref2b(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t h;
  
  uVar2 = uv_default_loop();
  uv_tcp_init(uVar2,&h);
  uv_listen(&h,0x80,fail_cb);
  uv_unref(&h);
  uv_close(&h,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  eval_a = 1;
  eval_b = (int64_t)close_cb_called;
  if (eval_b == 1) {
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    eval_a = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    eval_b = (int64_t)iVar1;
    if (eval_b == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar4 = "uv_loop_close(uv_default_loop())";
    pcVar3 = "0";
    uVar2 = 0xfe;
  }
  else {
    pcVar4 = "close_cb_called";
    pcVar3 = "1";
    uVar2 = 0xfd;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_ref2b) {
  uv_tcp_t h;
  uv_tcp_init(uv_default_loop(), &h);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_close((uv_handle_t*)&h, close_cb);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, close_cb_called);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}